

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O2

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::set_rom_is_overlay
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this,bool rom_is_overlay)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this->ROM_is_overlay_ = rom_is_overlay;
  local_28._8_8_ = 0;
  local_28._1_7_ = 0;
  local_28._M_pod_data[0] = rom_is_overlay;
  local_10 = std::
             _Function_handler<void_(std::function<void_(int,_Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/Macintosh.cpp:409:29)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(std::function<void_(int,_Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/Macintosh.cpp:409:29)>
             ::_M_manager;
  populate_memory_map(this,0,(function<void_(std::function<void_(int,_Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::BusDevice)>)>
                              *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void set_rom_is_overlay(bool rom_is_overlay) {
			ROM_is_overlay_ = rom_is_overlay;

			using Model = Analyser::Static::Macintosh::Target::Model;
			switch(model) {
				case Model::Mac128k:
				case Model::Mac512k:
				case Model::Mac512ke:
					populate_memory_map(0, [rom_is_overlay] (std::function<void(int target, BusDevice device)> map_to) {
						// Addresses up to $80 0000 aren't affected by this bit.
						if(rom_is_overlay) {
							// Up to $60 0000 mirrors of the ROM alternate with unassigned areas every $10 0000 byes.
							for(int c = 0; c < 0x600000; c += 0x100000) {
								map_to(c + 0x100000, (c & 0x100000) ? BusDevice::Unassigned : BusDevice::ROM);
							}
							map_to(0x800000, BusDevice::RAM);
						} else {
							map_to(0x400000, BusDevice::RAM);
							map_to(0x500000, BusDevice::ROM);
							map_to(0x800000, BusDevice::Unassigned);
						}
					});
				break;

				case Model::MacPlus:
					populate_memory_map(0, [rom_is_overlay] (std::function<void(int target, BusDevice device)> map_to) {
						// Addresses up to $80 0000 aren't affected by this bit.
						if(rom_is_overlay) {
							for(int c = 0; c < 0x580000; c += 0x20000) {
								map_to(c + 0x20000, ((c & 0x100000) || (c & 0x20000)) ? BusDevice::Unassigned : BusDevice::ROM);
							}
							map_to(0x600000, BusDevice::SCSI);
							map_to(0x800000, BusDevice::RAM);
						} else {
							map_to(0x400000, BusDevice::RAM);
							for(int c = 0x400000; c < 0x580000; c += 0x20000) {
								map_to(c + 0x20000, ((c & 0x100000) || (c & 0x20000)) ? BusDevice::Unassigned : BusDevice::ROM);
							}
							map_to(0x600000, BusDevice::SCSI);
							map_to(0x800000, BusDevice::Unassigned);
						}
					});
				break;
			}
		}